

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O3

bool dxil_spv::emit_wave_ballot_instruction(Impl *impl,CallInst *instruction)

{
  Id input_value;
  Id IVar1;
  Builder *this;
  Value *value;
  Operation *this_00;
  Capability local_24;
  
  this = Converter::Impl::builder(impl);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  input_value = Converter::Impl::get_id_for_value(impl,value,0);
  if (((impl->execution_model == ExecutionModelFragment) &&
      ((impl->options).strict_helper_lane_waveops == true)) &&
     (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
    input_value = build_masked_ballot(impl,input_value);
  }
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar1 = spv::Builder::makeVectorType(this,IVar1,4);
  this_00 = Converter::Impl::allocate(impl,OpGroupNonUniformBallot,(Value *)instruction,IVar1);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar1 = spv::Builder::makeIntConstant(this,IVar1,3,false);
  Operation::add_id(this_00,IVar1);
  Operation::add_id(this_00,input_value);
  Converter::Impl::add(impl,this_00,false);
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this->capabilities,&local_24);
  return true;
}

Assistant:

bool emit_wave_ballot_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id bool_value;

	bool_value = impl.get_id_for_value(instruction->getOperand(1));
	if (wave_op_needs_helper_lane_masking(impl))
		bool_value = build_masked_ballot(impl, bool_value);

	auto *op = impl.allocate(spv::OpGroupNonUniformBallot, instruction,
	                         builder.makeVectorType(builder.makeUintType(32), 4));
	op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	op->add_id(bool_value);

	impl.add(op);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	return true;
}